

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

BOOL Js::JavascriptExceptionOperators::GetCaller
               (JavascriptStackWalker *walker,JavascriptFunction **jsFunc)

{
  BOOL BVar1;
  uint uVar2;
  InterpreterStackFrame *pIVar3;
  ByteCodeReader *this;
  JavascriptFunction **jsFunc_local;
  JavascriptStackWalker *walker_local;
  
  BVar1 = JavascriptStackWalker::GetCaller(walker,jsFunc,true);
  if (BVar1 == 0) {
    walker_local._4_4_ = 0;
  }
  else {
    pIVar3 = JavascriptStackWalker::GetCurrentInterpreterFrame(walker);
    if (pIVar3 != (InterpreterStackFrame *)0x0) {
      pIVar3 = JavascriptStackWalker::GetCurrentInterpreterFrame(walker);
      this = InterpreterStackFrame::GetReader(pIVar3);
      uVar2 = ByteCodeReader::GetCurrentOffset(this);
      if (uVar2 == 0) {
        BVar1 = JavascriptStackWalker::GetCaller(walker,jsFunc,true);
        return BVar1;
      }
    }
    walker_local._4_4_ = 1;
  }
  return walker_local._4_4_;
}

Assistant:

BOOL JavascriptExceptionOperators::GetCaller(JavascriptStackWalker& walker, _Out_opt_ JavascriptFunction*& jsFunc)
    {
        if (! walker.GetCaller(&jsFunc))
        {
            return FALSE;
        }

        if (! walker.GetCurrentInterpreterFrame() ||
             walker.GetCurrentInterpreterFrame()->GetReader()->GetCurrentOffset() > 0)
        {
            return TRUE;
        }

        return walker.GetCaller(&jsFunc);
    }